

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdbinarypacking.h
# Opt level: O2

void __thiscall
FastPForLib::SIMDBinaryPacking::encodeArray
          (SIMDBinaryPacking *this,uint32_t *in,size_t length,uint32_t *out,size_t *nvalue)

{
  undefined1 auVar1 [16];
  uint32_t uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  uint32_t *puVar6;
  uint32_t i;
  long lVar7;
  ulong uVar8;
  __m128i *out_00;
  uint32_t Bs [16];
  uint32_t local_a8 [3];
  uint uStack_9c;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 uStack_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  uint32_t *local_60;
  uint32_t *local_58;
  uint32_t *local_50;
  size_t *local_48;
  uint32_t *local_40;
  uint32_t *local_38;
  
  local_48 = nvalue;
  checkifdivisibleby(length,0x80);
  *out = (uint32_t)length;
  out_00 = (__m128i *)(out + 1);
  local_50 = out;
  local_40 = in + length;
  while (in + 0x800 <= local_40) {
    local_38 = in + 0x800;
    puVar6 = in;
    for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
      local_60 = puVar6 + 0x80;
      local_58 = puVar6;
      uVar2 = maxbits<unsigned_int_const*>(&local_58,&local_60);
      local_a8[lVar7] = uVar2;
      puVar6 = puVar6 + 0x80;
    }
    *(uint32_t *)*out_00 = local_a8[2] << 8 | local_a8[1] << 0x10 | local_a8[0] << 0x18 | uStack_9c;
    *(uint *)((long)*out_00 + 4) =
         (int)uStack_90 << 8 | uStack_98._4_4_ << 0x10 | (int)uStack_98 << 0x18 | uStack_90._4_4_;
    *(uint *)(*out_00 + 1) =
         (int)uStack_80 << 8 | uStack_88._4_4_ << 0x10 | (int)uStack_88 << 0x18 | uStack_80._4_4_;
    *(uint *)((long)*out_00 + 0xc) =
         (int)uStack_70 << 8 | uStack_78._4_4_ << 0x10 | (int)uStack_78 << 0x18 | uStack_70._4_4_;
    out_00 = out_00 + 1;
    puVar6 = in;
    for (lVar7 = 0; in = local_38, lVar7 != 0x10; lVar7 = lVar7 + 1) {
      SIMD_fastpackwithoutmask_32(puVar6,out_00,local_a8[lVar7]);
      puVar6 = puVar6 + 0x80;
      out_00 = (__m128i *)((long)*out_00 + (ulong)(local_a8[lVar7] << 2) * 4);
    }
  }
  if (in < local_40) {
    uVar8 = 0;
    auVar1._8_8_ = (long)local_40 - (long)in >> 0x3f;
    auVar1._0_8_ = (long)local_40 - (long)in >> 2;
    uVar4 = SUB168(auVar1 / SEXT816(0x80),0);
    local_a8[0] = 0;
    local_a8[1] = 0;
    stack0xffffffffffffff60 = 0;
    uStack_98 = 0;
    uStack_90 = 0;
    uStack_88 = 0;
    uStack_80 = 0;
    uStack_78 = 0;
    uStack_70 = 0;
    for (uVar5 = 0; uVar5 < uVar4; uVar5 = (ulong)((int)uVar5 + 1)) {
      local_58 = in + uVar8;
      uVar8 = (ulong)((int)uVar8 + 0x80);
      local_60 = in + uVar8;
      uVar2 = maxbits<unsigned_int_const*>(&local_58,&local_60);
      local_a8[uVar5] = uVar2;
    }
    uVar5 = 0;
    *(uint32_t *)*out_00 = local_a8[2] << 8 | local_a8[1] << 0x10 | local_a8[0] << 0x18 | uStack_9c;
    *(uint *)((long)*out_00 + 4) =
         (int)uStack_90 << 8 | uStack_98._4_4_ << 0x10 | (int)uStack_98 << 0x18 | uStack_90._4_4_;
    *(uint *)(*out_00 + 1) =
         (int)uStack_80 << 8 | uStack_88._4_4_ << 0x10 | (int)uStack_88 << 0x18 | uStack_80._4_4_;
    *(uint *)((long)*out_00 + 0xc) =
         (int)uStack_70 << 8 | uStack_78._4_4_ << 0x10 | (int)uStack_78 << 0x18 | uStack_70._4_4_;
    out_00 = out_00 + 1;
    for (uVar3 = 0; uVar8 = (ulong)uVar3, uVar8 < uVar4; uVar3 = uVar3 + 1) {
      SIMD_fastpackwithoutmask_32(in + uVar5,out_00,local_a8[uVar8]);
      uVar5 = (ulong)((int)uVar5 + 0x80);
      out_00 = (__m128i *)((long)*out_00 + (ulong)(local_a8[uVar8] << 2) * 4);
    }
  }
  *local_48 = (long)out_00 - (long)local_50 >> 2;
  return;
}

Assistant:

void encodeArray(const uint32_t *in, const size_t length, uint32_t *out,
                   size_t &nvalue) {
    checkifdivisibleby(length, BlockSize);
    const uint32_t *const initout(out);
    *out++ = static_cast<uint32_t>(length);
    uint32_t Bs[HowManyMiniBlocks];
    const uint32_t *const final = in + length;
    for (; in + HowManyMiniBlocks * MiniBlockSize <= final;
         in += HowManyMiniBlocks * MiniBlockSize) {

      for (uint32_t i = 0; i < HowManyMiniBlocks; ++i)
        Bs[i] = maxbits(in + i * MiniBlockSize, in + (i + 1) * MiniBlockSize);
      *out++ = (Bs[0] << 24) | (Bs[1] << 16) | (Bs[2] << 8) | Bs[3];
      *out++ = (Bs[4] << 24) | (Bs[5] << 16) | (Bs[6] << 8) | Bs[7];
      *out++ = (Bs[8] << 24) | (Bs[9] << 16) | (Bs[10] << 8) | Bs[11];
      *out++ = (Bs[12] << 24) | (Bs[13] << 16) | (Bs[14] << 8) | Bs[15];
      for (uint32_t i = 0; i < HowManyMiniBlocks; ++i) {
        SIMD_fastpackwithoutmask_32(in + i * MiniBlockSize,
                                    reinterpret_cast<__m128i *>(out), Bs[i]);
        out += MiniBlockSize / 32 * Bs[i];
      }
    }
    if (in < final) {
      const size_t howmany = (final - in) / MiniBlockSize;
      memset(&Bs[0], 0, HowManyMiniBlocks * sizeof(uint32_t));
      for (uint32_t i = 0; i < howmany; ++i)
        Bs[i] = maxbits(in + i * MiniBlockSize, in + (i + 1) * MiniBlockSize);
      *out++ = (Bs[0] << 24) | (Bs[1] << 16) | (Bs[2] << 8) | Bs[3];
      *out++ = (Bs[4] << 24) | (Bs[5] << 16) | (Bs[6] << 8) | Bs[7];
      *out++ = (Bs[8] << 24) | (Bs[9] << 16) | (Bs[10] << 8) | Bs[11];
      *out++ = (Bs[12] << 24) | (Bs[13] << 16) | (Bs[14] << 8) | Bs[15];
      for (uint32_t i = 0; i < howmany; ++i) {
        SIMD_fastpackwithoutmask_32(in + i * MiniBlockSize,
                                    reinterpret_cast<__m128i *>(out), Bs[i]);
        out += MiniBlockSize / 32 * Bs[i];
      }
      in += howmany * MiniBlockSize;
      assert(in == final);
    }

    nvalue = out - initout;
  }